

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_gotoaddressdialog.h
# Opt level: O0

void __thiscall Ui_GoToAddressDialog::setupUi(Ui_GoToAddressDialog *this,QDialog *GoToAddressDialog)

{
  QWidget *pQVar1;
  QDialog *pQVar2;
  bool bVar3;
  QVBoxLayout *pQVar4;
  QGroupBox *pQVar5;
  QHBoxLayout *pQVar6;
  QLabel *pQVar7;
  HexSpinBox *pHVar8;
  QDialogButtonBox *pQVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  Object local_1c8 [8];
  Function local_1c0;
  code *local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  Object local_190 [8];
  QFlags<Qt::AlignmentFlag> local_188;
  Int local_184;
  QByteArrayView local_180;
  QString local_170;
  QFlags<Qt::AlignmentFlag> local_154;
  QFlags<Qt::AlignmentFlag> local_150;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_14c;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_148;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_144;
  undefined1 auStack_140 [4];
  QSizePolicy sizePolicy;
  QString local_130;
  QFlags<Qt::AlignmentFlag> local_114;
  QByteArrayView local_110;
  QString local_100;
  QFlags<Qt::WindowType> local_e4;
  QByteArrayView local_e0;
  QString local_d0;
  QByteArrayView local_b8;
  QString local_a8;
  QByteArrayView local_90;
  QString local_80;
  QByteArrayView local_68;
  QString local_58;
  QString local_30;
  QDialog *local_18;
  QDialog *GoToAddressDialog_local;
  Ui_GoToAddressDialog *this_local;
  
  local_18 = GoToAddressDialog;
  GoToAddressDialog_local = (QDialog *)this;
  QObject::objectName();
  bVar3 = QString::isEmpty(&local_30);
  QString::~QString(&local_30);
  pQVar2 = local_18;
  if (bVar3) {
    QByteArrayView::QByteArrayView<18ul>(&local_68,(char (*) [18])"GoToAddressDialog");
    QVar10.m_data = (storage_type *)local_68.m_size;
    QVar10.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar10);
    QObject::setObjectName((QString *)pQVar2);
    QString::~QString(&local_58);
  }
  QWidget::resize((QWidget *)local_18,0x10e,0x56);
  QDialog::setModal(SUB81(local_18,0));
  pQVar4 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar4,(QWidget *)local_18);
  this->verticalLayout = pQVar4;
  (**(code **)(*(long *)this->verticalLayout + 0x68))(this->verticalLayout,5);
  pQVar4 = this->verticalLayout;
  QByteArrayView::QByteArrayView<15ul>(&local_90,(char (*) [15])"verticalLayout");
  QVar11.m_data = (storage_type *)local_90.m_size;
  QVar11.m_size = (qsizetype)&local_80;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_80);
  QLayout::setContentsMargins((int)this->verticalLayout,5,5,5);
  pQVar5 = (QGroupBox *)operator_new(0x28);
  QGroupBox::QGroupBox(pQVar5,(QWidget *)local_18);
  this->groupBox = pQVar5;
  pQVar5 = this->groupBox;
  QByteArrayView::QByteArrayView<9ul>(&local_b8,(char (*) [9])"groupBox");
  QVar12.m_data = (storage_type *)local_b8.m_size;
  QVar12.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar12);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_a8);
  pQVar6 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar6,(QWidget *)this->groupBox);
  this->horizontalLayout = pQVar6;
  (**(code **)(*(long *)this->horizontalLayout + 0x68))(this->horizontalLayout,5);
  pQVar6 = this->horizontalLayout;
  QByteArrayView::QByteArrayView<17ul>(&local_e0,(char (*) [17])"horizontalLayout");
  QVar13.m_data = (storage_type *)local_e0.m_size;
  QVar13.m_size = (qsizetype)&local_d0;
  QString::fromUtf8(QVar13);
  QObject::setObjectName((QString *)pQVar6);
  QString::~QString(&local_d0);
  QLayout::setContentsMargins((int)this->horizontalLayout,5,5,5);
  pQVar7 = (QLabel *)operator_new(0x28);
  pQVar1 = (QWidget *)this->groupBox;
  QFlags<Qt::WindowType>::QFlags(&local_e4);
  QLabel::QLabel(pQVar7,pQVar1,(QFlags_conflict1 *)(ulong)local_e4.i);
  this->label = pQVar7;
  pQVar7 = this->label;
  QByteArrayView::QByteArrayView<6ul>(&local_110,(char (*) [6])"label");
  QVar14.m_data = (storage_type *)local_110.m_size;
  QVar14.m_size = (qsizetype)&local_100;
  QString::fromUtf8(QVar14);
  QObject::setObjectName((QString *)pQVar7);
  QString::~QString(&local_100);
  pQVar1 = (QWidget *)this->horizontalLayout;
  pQVar7 = this->label;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_114);
  QBoxLayout::addWidget(pQVar1,(int)pQVar7,(QFlags_conflict1 *)0x0);
  pHVar8 = (HexSpinBox *)operator_new(0x38);
  HexSpinBox::HexSpinBox(pHVar8,(QWidget *)this->groupBox);
  this->hexSpinBox = pHVar8;
  pHVar8 = this->hexSpinBox;
  QByteArrayView::QByteArrayView<11ul>((QByteArrayView *)auStack_140,(char (*) [11])"hexSpinBox");
  QVar15.m_data = _auStack_140;
  QVar15.m_size = (qsizetype)&local_130;
  QString::fromUtf8(QVar15);
  QObject::setObjectName((QString *)pHVar8);
  QString::~QString(&local_130);
  QSizePolicy::QSizePolicy((QSizePolicy *)&local_144.bits,Expanding,Fixed,DefaultType);
  QSizePolicy::setHorizontalStretch((QSizePolicy *)&local_144.bits,0);
  QSizePolicy::setVerticalStretch((QSizePolicy *)&local_144.bits,0);
  local_148.data = QWidget::sizePolicy();
  bVar3 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_148.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_144.bits,bVar3);
  local_14c = local_144;
  QWidget::setSizePolicy((QSizePolicy *)this->hexSpinBox);
  pQVar1 = (QWidget *)this->horizontalLayout;
  pHVar8 = this->hexSpinBox;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_150);
  QBoxLayout::addWidget(pQVar1,(int)pHVar8,(QFlags_conflict1 *)0x0);
  pQVar1 = (QWidget *)this->verticalLayout;
  pQVar5 = this->groupBox;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_154);
  QBoxLayout::addWidget(pQVar1,(int)pQVar5,(QFlags_conflict1 *)0x0);
  pQVar9 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(pQVar9,(QWidget *)local_18);
  this->buttonBox = pQVar9;
  pQVar9 = this->buttonBox;
  QByteArrayView::QByteArrayView<10ul>(&local_180,(char (*) [10])"buttonBox");
  QVar16.m_data = (storage_type *)local_180.m_size;
  QVar16.m_size = (qsizetype)&local_170;
  QString::fromUtf8(QVar16);
  QObject::setObjectName((QString *)pQVar9);
  QString::~QString(&local_170);
  QDialogButtonBox::setOrientation((Orientation)this->buttonBox);
  pQVar9 = this->buttonBox;
  local_184 = (Int)operator|(Cancel,FirstButton);
  QDialogButtonBox::setStandardButtons((QFlags_conflict1 *)pQVar9);
  pQVar1 = (QWidget *)this->verticalLayout;
  pQVar9 = this->buttonBox;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_188);
  QBoxLayout::addWidget(pQVar1,(int)pQVar9,(QFlags_conflict1 *)0x0);
  retranslateUi(this,local_18);
  pQVar2 = local_18;
  pQVar9 = this->buttonBox;
  local_198 = 0;
  local_1a0 = 0x1b9;
  local_1c0 = QNonConstOverload<>::operator()((QNonConstOverload<> *)&qOverload<>,0x1b9);
  local_1b0 = QDialogButtonBox::accepted;
  local_1a8 = 0;
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_190,(offset_in_QDialogButtonBox_to_subr)pQVar9,
             (Object *)QDialogButtonBox::accepted,0,(ConnectionType)pQVar2);
  QMetaObject::Connection::~Connection((Connection *)local_190);
  pQVar2 = local_18;
  pQVar9 = this->buttonBox;
  QNonConstOverload<>::operator()((QNonConstOverload<> *)&qOverload<>,0x1c1);
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_1c8,(offset_in_QDialogButtonBox_to_subr)pQVar9,
             (Object *)QDialogButtonBox::rejected,0,(ConnectionType)pQVar2);
  QMetaObject::Connection::~Connection((Connection *)local_1c8);
  QMetaObject::connectSlotsByName((QObject *)local_18);
  return;
}

Assistant:

void setupUi(QDialog *GoToAddressDialog)
    {
        if (GoToAddressDialog->objectName().isEmpty())
            GoToAddressDialog->setObjectName(QString::fromUtf8("GoToAddressDialog"));
        GoToAddressDialog->resize(270, 86);
        GoToAddressDialog->setModal(false);
        verticalLayout = new QVBoxLayout(GoToAddressDialog);
        verticalLayout->setSpacing(5);
        verticalLayout->setObjectName(QString::fromUtf8("verticalLayout"));
        verticalLayout->setContentsMargins(5, 5, 5, 5);
        groupBox = new QGroupBox(GoToAddressDialog);
        groupBox->setObjectName(QString::fromUtf8("groupBox"));
        horizontalLayout = new QHBoxLayout(groupBox);
        horizontalLayout->setSpacing(5);
        horizontalLayout->setObjectName(QString::fromUtf8("horizontalLayout"));
        horizontalLayout->setContentsMargins(5, 5, 5, 5);
        label = new QLabel(groupBox);
        label->setObjectName(QString::fromUtf8("label"));

        horizontalLayout->addWidget(label);

        hexSpinBox = new HexSpinBox(groupBox);
        hexSpinBox->setObjectName(QString::fromUtf8("hexSpinBox"));
        QSizePolicy sizePolicy(QSizePolicy::Expanding, QSizePolicy::Fixed);
        sizePolicy.setHorizontalStretch(0);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(hexSpinBox->sizePolicy().hasHeightForWidth());
        hexSpinBox->setSizePolicy(sizePolicy);

        horizontalLayout->addWidget(hexSpinBox);


        verticalLayout->addWidget(groupBox);

        buttonBox = new QDialogButtonBox(GoToAddressDialog);
        buttonBox->setObjectName(QString::fromUtf8("buttonBox"));
        buttonBox->setOrientation(Qt::Horizontal);
        buttonBox->setStandardButtons(QDialogButtonBox::Cancel|QDialogButtonBox::Ok);

        verticalLayout->addWidget(buttonBox);


        retranslateUi(GoToAddressDialog);
        QObject::connect(buttonBox, &QDialogButtonBox::accepted, GoToAddressDialog, qOverload<>(&QDialog::accept));
        QObject::connect(buttonBox, &QDialogButtonBox::rejected, GoToAddressDialog, qOverload<>(&QDialog::reject));

        QMetaObject::connectSlotsByName(GoToAddressDialog);
    }